

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

void __thiscall miniros::NodeHandle::construct(NodeHandle *this,string *ns,bool validate_name)

{
  bool bVar1;
  ServiceManagerPtr *sm;
  byte in_DL;
  NodeHandleBackingCollection *in_RSI;
  string *in_RDI;
  scoped_lock<std::mutex> lock;
  bool enabled;
  char *in_stack_fffffffffffffef8;
  LogLocation *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  LogLocation *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  NodeHandleBackingCollection *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_b8 [7];
  undefined1 in_stack_ffffffffffffff4f;
  string *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  string local_98 [39];
  undefined1 local_71;
  undefined1 local_4d;
  undefined1 local_39 [40];
  byte local_11;
  NodeHandleBackingCollection *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  bVar1 = isInitialized();
  if (!bVar1) {
    if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((construct::loc.initialized_ ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff20 = (NodeHandleBackingCollection *)local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      console::initializeLogLocation
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_RDI
                 ,(Level)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      std::__cxx11::string::~string((string *)(local_39 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_39);
    }
    if (construct::loc.level_ != Fatal) {
      console::setLogLocationLevel
                (in_stack_ffffffffffffff00,(Level)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      console::checkLogLocationEnabled(in_stack_ffffffffffffff10);
    }
    in_stack_ffffffffffffff1f = (construct::loc.logger_enabled_ & 1U) != 0;
    local_4d = in_stack_ffffffffffffff1f;
    if ((bool)in_stack_ffffffffffffff1f) {
      in_stack_fffffffffffffef8 =
           "You must call miniros::init() before creating the first NodeHandle";
      console::print((FilterBase *)0x0,construct::loc.logger_,(Level)(ulong)construct::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/node_handle.cpp"
                     ,0xa0,"void miniros::NodeHandle::construct(const std::string &, bool)");
    }
  }
  sm = (ServiceManagerPtr *)operator_new(0xa8);
  local_71 = 1;
  getTopicManager((NodeHandle *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  getServiceManager((NodeHandle *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  NodeHandleBackingCollection::NodeHandleBackingCollection
            (in_stack_ffffffffffffff20,
             (TopicManagerPtr *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),sm);
  local_71 = 0;
  in_RDI[5]._M_string_length = (size_type)sm;
  std::shared_ptr<miniros::ServiceManager>::~shared_ptr
            ((shared_ptr<miniros::ServiceManager> *)0x477af6);
  std::shared_ptr<miniros::TopicManager>::~shared_ptr((shared_ptr<miniros::TopicManager> *)0x477b03)
  ;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)local_10);
  if ((local_11 & 1) == 0) {
    resolveName((NodeHandle *)local_b8,in_RDI,local_10,1);
    std::__cxx11::string::operator=((string *)in_RDI,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  else {
    resolveName((NodeHandle *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                (bool)in_stack_ffffffffffffff4f);
    std::__cxx11::string::operator=((string *)in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  in_RDI[5].field_2._M_local_buf[0] = '\x01';
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff00,
             (mutex_type *)in_stack_fffffffffffffef8);
  if ((g_nh_refcount == 0) && (bVar1 = isStarted(), !bVar1)) {
    g_node_started_by_nh = 1;
    miniros::start();
  }
  g_nh_refcount = g_nh_refcount + 1;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x477cac);
  return;
}

Assistant:

void NodeHandle::construct(const std::string& ns, bool validate_name)
{
  if (!miniros::isInitialized())
  {
    MINIROS_FATAL("You must call miniros::init() before creating the first NodeHandle");
    MINIROS_BREAK();
  }

  collection_ = new NodeHandleBackingCollection(getTopicManager(), getServiceManager());
  unresolved_namespace_ = ns;
  // if callback_queue_ is nonnull, we are in a non-nullary constructor

  if (validate_name)
    namespace_ = resolveName(ns, true);
  else
    {
      namespace_ = resolveName(ns, true, no_validate());
      // FIXME validate namespace_ now
    }
  ok_ = true;

  std::scoped_lock<std::mutex> lock(g_nh_refcount_mutex);

  if (g_nh_refcount == 0 && !miniros::isStarted())
  {
    g_node_started_by_nh = true;
    miniros::start();
  }

  ++g_nh_refcount;
}